

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O2

void uset_addString_63(USet *set,UChar *str,int32_t strLen)

{
  UnicodeString s;
  ConstChar16Ptr local_60;
  UChar *local_58;
  UnicodeString local_48;
  
  local_60.p_ = str;
  icu_63::UnicodeString::UnicodeString(&local_48,(byte)((uint)strLen >> 0x1f),&local_60,strLen);
  local_58 = local_60.p_;
  icu_63::UnicodeSet::add((UnicodeSet *)set,&local_48);
  icu_63::UnicodeString::~UnicodeString(&local_48);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uset_addString(USet* set, const UChar* str, int32_t strLen) {
    // UnicodeString handles -1 for strLen
    UnicodeString s(strLen<0, str, strLen);
    ((UnicodeSet*) set)->UnicodeSet::add(s);
}